

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O1

int __thiscall MixerContext::auto_matrix(MixerContext *this)

{
  cubeb_sample_format cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  cubeb_channel_layout layout;
  cubeb_channel_layout layout_00;
  uint uVar6;
  cubeb_log_level cVar7;
  cubeb_log_callback p_Var8;
  double (*padVar9) [32];
  uint32_t i;
  long lVar10;
  ulong uVar11;
  char *fmt;
  double *pdVar12;
  double (*padVar13) [32];
  float (*pafVar14) [32];
  uint32_t i_2;
  uint32_t line;
  double *pdVar15;
  undefined8 *puVar16;
  ulong uVar17;
  long lVar18;
  uint32_t j;
  ulong uVar19;
  int iVar20;
  undefined8 *puVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  undefined8 local_a48 [2];
  double local_a38;
  double local_a30;
  double local_a28;
  double local_a18 [2];
  double local_a08;
  double local_a00;
  double local_9a8;
  double local_9a0;
  double local_990;
  double local_980;
  double local_978;
  double local_968;
  undefined1 local_928 [16];
  double local_918;
  double local_910;
  undefined1 local_908 [16];
  double local_8f8;
  double local_8f0;
  double local_8e8;
  undefined1 local_8e0 [280];
  double local_7c8;
  double local_7c0;
  double local_738;
  double local_728;
  undefined1 local_5a8 [40];
  undefined1 local_580 [104];
  double local_518;
  double local_4f8;
  double local_480;
  double local_468;
  
  puVar21 = local_a48;
  puVar16 = local_a48;
  memset(local_a48,0,0xa20);
  layout = clean_layout(this->_in_ch_layout);
  layout_00 = clean_layout(this->_out_ch_layout);
  bVar5 = sane_layout(layout);
  if (bVar5) {
    bVar5 = sane_layout(layout_00);
    if (bVar5) {
      lVar10 = 0;
      do {
        if ((1 << ((byte)lVar10 & 0x1f) & layout & layout_00) != 0) {
          *puVar21 = 0x3ff0000000000000;
        }
        lVar10 = lVar10 + 1;
        puVar21 = puVar21 + 0x13;
      } while (lVar10 != 0x12);
      uVar6 = layout & ~layout_00;
      if (((~layout_00 & 3) == 0) && ((uVar6 & 4) != 0)) {
        if ((layout & 3) == 0) {
          dVar25 = 0.7071067811865476;
        }
        else {
          dVar25 = (double)this->_center_mix_level;
        }
        local_a38 = local_a38 + dVar25;
        local_9a8 = dVar25 + local_9a8;
      }
      if (((layout_00 & 4) != 0) && ((uVar6 & 3) != 0)) {
        auVar24._8_4_ = SUB84((double)local_928._8_8_ + 0.7071067811865476,0);
        auVar24._0_8_ = (double)local_928._0_8_ + 0.7071067811865476;
        auVar24._12_4_ = (int)((ulong)((double)local_928._8_8_ + 0.7071067811865476) >> 0x20);
        local_928 = auVar24;
        if ((layout & 4) != 0) {
          local_918 = (double)this->_center_mix_level * 1.4142135623730951;
        }
      }
      if ((uVar6 >> 8 & 1) != 0) {
        if ((layout_00 & 0x10) == 0) {
          if ((layout_00 >> 9 & 1) == 0) {
            if ((layout_00 & 1) == 0) {
              if ((layout_00 & 4) != 0) {
                local_8e8 = (double)this->_surround_mix_level * 0.7071067811865476 + local_8e8;
              }
            }
            else {
              dVar25 = (double)this->_surround_mix_level * 0.7071067811865476;
              local_a08 = local_a08 + dVar25;
              local_978 = dVar25 + local_978;
            }
          }
          else {
            local_4f8 = local_4f8 + 0.7071067811865476;
            local_468 = local_468 + 0.7071067811865476;
          }
        }
        else {
          local_7c8 = local_7c8 + 0.7071067811865476;
          local_738 = local_738 + 0.7071067811865476;
        }
      }
      if ((uVar6 & 0x10) != 0) {
        if ((layout_00 >> 8 & 1) == 0) {
          if ((layout_00 >> 9 & 1) == 0) {
            if ((layout_00 & 1) == 0) {
              if ((layout_00 & 4) != 0) {
                dVar25 = (double)this->_surround_mix_level * 0.7071067811865476;
                dVar26 = dVar25 + (double)local_908._8_8_;
                local_908._8_4_ = SUB84(dVar26,0);
                local_908._0_8_ = dVar25 + (double)local_908._0_8_;
                local_908._12_4_ = (int)((ulong)dVar26 >> 0x20);
              }
            }
            else {
              local_a28 = local_a28 + (double)this->_surround_mix_level;
              local_990 = (double)this->_surround_mix_level + local_990;
            }
          }
          else {
            if ((layout >> 9 & 1) == 0) {
              dVar25 = 1.0;
            }
            else {
              dVar25 = 0.7071067811865476;
            }
            local_518 = local_518 + dVar25;
            local_480 = dVar25 + local_480;
          }
        }
        else {
          auVar4._8_4_ = SUB84((double)local_5a8._8_8_ + 0.7071067811865476,0);
          auVar4._0_8_ = (double)local_5a8._0_8_ + 0.7071067811865476;
          auVar4._12_4_ = (int)((ulong)((double)local_5a8._8_8_ + 0.7071067811865476) >> 0x20);
          local_5a8._0_16_ = auVar4;
        }
      }
      if ((uVar6 >> 9 & 1) != 0) {
        if ((layout_00 & 0x10) == 0) {
          if ((layout_00 >> 8 & 1) == 0) {
            if ((layout_00 & 1) == 0) {
              if ((layout_00 & 4) != 0) {
                dVar25 = (double)this->_surround_mix_level * 0.7071067811865476;
                dVar26 = dVar25 + (double)local_8e0._8_8_;
                local_8e0._8_4_ = SUB84(dVar26,0);
                local_8e0._0_8_ = dVar25 + (double)local_8e0._0_8_;
                local_8e0._12_4_ = (int)((ulong)dVar26 >> 0x20);
              }
            }
            else {
              local_a00 = local_a00 + (double)this->_surround_mix_level;
              local_968 = (double)this->_surround_mix_level + local_968;
            }
          }
          else {
            auVar3._8_4_ = SUB84((double)local_580._8_8_ + 0.7071067811865476,0);
            auVar3._0_8_ = (double)local_580._0_8_ + 0.7071067811865476;
            auVar3._12_4_ = (int)((ulong)((double)local_580._8_8_ + 0.7071067811865476) >> 0x20);
            local_580._0_16_ = auVar3;
          }
        }
        else {
          if ((layout & 0x10) == 0) {
            dVar25 = 1.0;
          }
          else {
            dVar25 = 0.7071067811865476;
          }
          local_7c0 = local_7c0 + dVar25;
          local_728 = dVar25 + local_728;
        }
      }
      if ((layout_00 & 5) != 0 && (uVar6 & 0x40) != 0) {
        bVar5 = (layout_00 & 1) == 0;
        dVar25 = *(double *)(&DAT_001431d0 + (ulong)bVar5 * 8);
        pdVar12 = local_a18;
        if (bVar5) {
          pdVar12 = &local_8f8;
        }
        pdVar15 = &local_980;
        if (bVar5) {
          pdVar15 = &local_8f0;
        }
        *pdVar12 = *pdVar12 + dVar25;
        *pdVar15 = dVar25 + *pdVar15;
      }
      if ((uVar6 & 8) != 0) {
        if ((layout_00 & 4) == 0) {
          if ((layout_00 & 1) != 0) {
            dVar25 = (double)this->_lfe_mix_level * 0.7071067811865476;
            local_a30 = local_a30 + dVar25;
            local_9a0 = dVar25 + local_9a0;
          }
        }
        else {
          local_910 = (double)this->_lfe_mix_level + local_910;
        }
      }
      padVar9 = this->_matrix;
      uVar22 = 0;
      uVar23 = 0;
      uVar11 = 0;
      uVar17 = 0;
      do {
        if ((layout_00 >> ((uint)uVar11 & 0x1f) & 1) != 0) {
          dVar25 = 0.0;
          uVar6 = 0x3ff00000;
          if ((layout_00 & layout & 1 << ((byte)uVar11 & 0x1f)) == 0) {
            uVar6 = 0;
          }
          uVar19 = 0;
          iVar20 = 0;
          do {
            if ((layout >> ((uint)uVar19 & 0x1f) & 1) != 0) {
              if (uVar19 < 0x12 && uVar11 < 0x12) {
                dVar26 = *(double *)((long)puVar16 + uVar19 * 8);
              }
              else {
                dVar26 = (double)((ulong)uVar6 << 0x20);
                if (uVar11 != uVar19) {
                  dVar26 = 0.0;
                }
              }
              padVar9[uVar17][iVar20] = dVar26;
              dVar25 = dVar25 + ABS(padVar9[uVar17][iVar20]);
              iVar20 = iVar20 + 1;
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != 0x20);
          if (dVar25 <= (double)CONCAT44(uVar23,uVar22)) {
            dVar25 = (double)CONCAT44(uVar23,uVar22);
          }
          uVar17 = (ulong)((int)uVar17 + 1);
          uVar22 = SUB84(dVar25,0);
          uVar23 = (undefined4)((ulong)dVar25 >> 0x20);
        }
        uVar11 = uVar11 + 1;
        puVar16 = (undefined8 *)((long)puVar16 + 0x90);
      } while (uVar11 != 0x20);
      cVar1 = this->_format;
      dVar25 = *(double *)(&DAT_001431f0 + (ulong)(cVar1 == CUBEB_SAMPLE_S16LE) * 8);
      if (dVar25 <= (double)CONCAT44(uVar23,uVar22) && (double)CONCAT44(uVar23,uVar22) != dVar25) {
        dVar25 = (double)CONCAT44(uVar23,uVar22) / dVar25;
        padVar13 = this->_matrix;
        lVar10 = 0;
        do {
          lVar18 = 0;
          do {
            auVar2._8_4_ = SUB84(dVar25,0);
            auVar2._0_8_ = dVar25;
            auVar2._12_4_ = (int)((ulong)dVar25 >> 0x20);
            auVar24 = divpd(*(undefined1 (*) [16])(*padVar13 + lVar18),auVar2);
            *(undefined1 (*) [16])(*padVar13 + lVar18) = auVar24;
            lVar18 = lVar18 + 2;
          } while (lVar18 != 0x20);
          lVar10 = lVar10 + 1;
          padVar13 = padVar13 + 1;
        } while (lVar10 != 0x20);
      }
      if (cVar1 == CUBEB_SAMPLE_FLOAT32LE) {
        pafVar14 = this->_matrix_flt;
        lVar10 = 0;
        do {
          lVar18 = 0;
          do {
            *(ulong *)(*pafVar14 + lVar18) =
                 CONCAT44((float)(*padVar9 + lVar18)[1],(float)(*padVar9)[lVar18]);
            lVar18 = lVar18 + 2;
          } while (lVar18 != 0x20);
          lVar10 = lVar10 + 1;
          padVar9 = padVar9 + 1;
          pafVar14 = pafVar14 + 1;
        } while (lVar10 != 0x20);
      }
      return 0;
    }
    cVar7 = cubeb_log_get_level();
    if ((int)cVar7 < 1) {
      return -1;
    }
    p_Var8 = cubeb_log_get_callback();
    if (p_Var8 == (cubeb_log_callback)0x0) {
      return -1;
    }
    uVar6 = this->_out_ch_layout;
    fmt = "Output Layout %x is not supported";
    line = 0xc6;
  }
  else {
    cVar7 = cubeb_log_get_level();
    if ((int)cVar7 < 1) {
      return -1;
    }
    p_Var8 = cubeb_log_get_callback();
    if (p_Var8 == (cubeb_log_callback)0x0) {
      return -1;
    }
    uVar6 = this->_in_ch_layout;
    fmt = "Input Layout %x is not supported";
    line = 0xc1;
  }
  cubeb_log_internal("cubeb_mixer.cpp",line,fmt,(ulong)uVar6);
  return -1;
}

Assistant:

int
MixerContext::auto_matrix()
{
  double matrix[NUM_NAMED_CHANNELS][NUM_NAMED_CHANNELS] = {{0}};
  double maxcoef = 0;
  double maxval;

  cubeb_channel_layout in_ch_layout = clean_layout(_in_ch_layout);
  cubeb_channel_layout out_ch_layout = clean_layout(_out_ch_layout);

  if (!sane_layout(in_ch_layout)) {
    // Channel Not Supported
    LOG("Input Layout %x is not supported", _in_ch_layout);
    return -1;
  }

  if (!sane_layout(out_ch_layout)) {
    LOG("Output Layout %x is not supported", _out_ch_layout);
    return -1;
  }

  for (uint32_t i = 0; i < FF_ARRAY_ELEMS(matrix); i++) {
    if (in_ch_layout & out_ch_layout & (1U << i)) {
      matrix[i][i] = 1.0;
    }
  }

  cubeb_channel_layout unaccounted = in_ch_layout & ~out_ch_layout;

  // Rematrixing is done via a matrix of coefficient that should be applied to
  // all channels. Channels are treated as pair and must be symmetrical (if a
  // left channel exists, the corresponding right should exist too) unless the
  // output layout has similar layout. Channels are then mixed toward the front
  // center or back center if they exist with a slight bias toward the front.

  if (unaccounted & CHANNEL_FRONT_CENTER) {
    if ((out_ch_layout & CUBEB_LAYOUT_STEREO) == CUBEB_LAYOUT_STEREO) {
      if (in_ch_layout & CUBEB_LAYOUT_STEREO) {
        matrix[FRONT_LEFT][FRONT_CENTER] += _center_mix_level;
        matrix[FRONT_RIGHT][FRONT_CENTER] += _center_mix_level;
      } else {
        matrix[FRONT_LEFT][FRONT_CENTER] += M_SQRT1_2;
        matrix[FRONT_RIGHT][FRONT_CENTER] += M_SQRT1_2;
      }
    }
  }
  if (unaccounted & CUBEB_LAYOUT_STEREO) {
    if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][FRONT_LEFT] += M_SQRT1_2;
      matrix[FRONT_CENTER][FRONT_RIGHT] += M_SQRT1_2;
      if (in_ch_layout & CHANNEL_FRONT_CENTER)
        matrix[FRONT_CENTER][FRONT_CENTER] = _center_mix_level * M_SQRT2;
    }
  }

  if (unaccounted & CHANNEL_BACK_CENTER) {
    if (out_ch_layout & CHANNEL_BACK_LEFT) {
      matrix[BACK_LEFT][BACK_CENTER] += M_SQRT1_2;
      matrix[BACK_RIGHT][BACK_CENTER] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_SIDE_LEFT) {
      matrix[SIDE_LEFT][BACK_CENTER] += M_SQRT1_2;
      matrix[SIDE_RIGHT][BACK_CENTER] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][BACK_CENTER] += _surround_mix_level * M_SQRT1_2;
      matrix[FRONT_RIGHT][BACK_CENTER] += _surround_mix_level * M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][BACK_CENTER] += _surround_mix_level * M_SQRT1_2;
    }
  }
  if (unaccounted & CHANNEL_BACK_LEFT) {
    if (out_ch_layout & CHANNEL_BACK_CENTER) {
      matrix[BACK_CENTER][BACK_LEFT] += M_SQRT1_2;
      matrix[BACK_CENTER][BACK_RIGHT] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_SIDE_LEFT) {
      if (in_ch_layout & CHANNEL_SIDE_LEFT) {
        matrix[SIDE_LEFT][BACK_LEFT] += M_SQRT1_2;
        matrix[SIDE_RIGHT][BACK_RIGHT] += M_SQRT1_2;
      } else {
        matrix[SIDE_LEFT][BACK_LEFT] += 1.0;
        matrix[SIDE_RIGHT][BACK_RIGHT] += 1.0;
      }
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][BACK_LEFT] += _surround_mix_level;
      matrix[FRONT_RIGHT][BACK_RIGHT] += _surround_mix_level;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][BACK_LEFT] += _surround_mix_level * M_SQRT1_2;
      matrix[FRONT_CENTER][BACK_RIGHT] += _surround_mix_level * M_SQRT1_2;
    }
  }

  if (unaccounted & CHANNEL_SIDE_LEFT) {
    if (out_ch_layout & CHANNEL_BACK_LEFT) {
      /* if back channels do not exist in the input, just copy side
         channels to back channels, otherwise mix side into back */
      if (in_ch_layout & CHANNEL_BACK_LEFT) {
        matrix[BACK_LEFT][SIDE_LEFT] += M_SQRT1_2;
        matrix[BACK_RIGHT][SIDE_RIGHT] += M_SQRT1_2;
      } else {
        matrix[BACK_LEFT][SIDE_LEFT] += 1.0;
        matrix[BACK_RIGHT][SIDE_RIGHT] += 1.0;
      }
    } else if (out_ch_layout & CHANNEL_BACK_CENTER) {
      matrix[BACK_CENTER][SIDE_LEFT] += M_SQRT1_2;
      matrix[BACK_CENTER][SIDE_RIGHT] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][SIDE_LEFT] += _surround_mix_level;
      matrix[FRONT_RIGHT][SIDE_RIGHT] += _surround_mix_level;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][SIDE_LEFT] += _surround_mix_level * M_SQRT1_2;
      matrix[FRONT_CENTER][SIDE_RIGHT] += _surround_mix_level * M_SQRT1_2;
    }
  }

  if (unaccounted & CHANNEL_FRONT_LEFT_OF_CENTER) {
    if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][FRONT_LEFT_OF_CENTER] += 1.0;
      matrix[FRONT_RIGHT][FRONT_RIGHT_OF_CENTER] += 1.0;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][FRONT_LEFT_OF_CENTER] += M_SQRT1_2;
      matrix[FRONT_CENTER][FRONT_RIGHT_OF_CENTER] += M_SQRT1_2;
    }
  }
  /* mix LFE into front left/right or center */
  if (unaccounted & CHANNEL_LOW_FREQUENCY) {
    if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][LOW_FREQUENCY] += _lfe_mix_level;
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][LOW_FREQUENCY] += _lfe_mix_level * M_SQRT1_2;
      matrix[FRONT_RIGHT][LOW_FREQUENCY] += _lfe_mix_level * M_SQRT1_2;
    }
  }

  // Normalize the conversion matrix.
  for (uint32_t out_i = 0, i = 0; i < CHANNELS_MAX; i++) {
    double sum = 0;
    int in_i = 0;
    if ((out_ch_layout & (1U << i)) == 0) {
      continue;
    }
    for (uint32_t j = 0; j < CHANNELS_MAX; j++) {
      if ((in_ch_layout & (1U << j)) == 0) {
        continue;
      }
      if (i < FF_ARRAY_ELEMS(matrix) && j < FF_ARRAY_ELEMS(matrix[0])) {
        _matrix[out_i][in_i] = matrix[i][j];
      } else {
        _matrix[out_i][in_i] =
            i == j && (in_ch_layout & out_ch_layout & (1U << i));
      }
      sum += fabs(_matrix[out_i][in_i]);
      in_i++;
    }
    maxcoef = std::max(maxcoef, sum);
    out_i++;
  }

  if (_format == CUBEB_SAMPLE_S16NE) {
    maxval = 1.0;
  } else {
    maxval = INT_MAX;
  }

  // Normalize matrix if needed.
  if (maxcoef > maxval) {
    maxcoef /= maxval;
    for (uint32_t i = 0; i < CHANNELS_MAX; i++)
      for (uint32_t j = 0; j < CHANNELS_MAX; j++) {
        _matrix[i][j] /= maxcoef;
      }
  }

  if (_format == CUBEB_SAMPLE_FLOAT32NE) {
    for (uint32_t i = 0; i < FF_ARRAY_ELEMS(_matrix); i++) {
      for (uint32_t j = 0; j < FF_ARRAY_ELEMS(_matrix[0]); j++) {
        _matrix_flt[i][j] = _matrix[i][j];
      }
    }
  }

  return 0;
}